

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

int traverseephemeron(global_State *g,Table *h,int inv)

{
  Node *pNVar1;
  byte *pbVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  GCObject *pGVar9;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  int local_34;
  
  uVar5 = luaH_realasize(h);
  bVar12 = h->lsizenode;
  local_34 = 0;
  for (lVar10 = 0; (ulong)uVar5 << 4 != lVar10; lVar10 = lVar10 + 0x10) {
    if ((((&h->array->tt_)[lVar10] & 0x40) != 0) &&
       (pGVar9 = *(GCObject **)((long)&h->array->value_ + lVar10), (pGVar9->marked & 0x18) != 0)) {
      reallymarkobject(g,pGVar9);
      local_34 = 1;
    }
  }
  uVar11 = 1L << (bVar12 & 0x3f);
  uVar5 = (uint)uVar11;
  bVar3 = false;
  bVar4 = false;
  for (uVar8 = 0; uVar5 = uVar5 - 1, uVar8 != uVar11; uVar8 = uVar8 + 1) {
    uVar7 = (ulong)uVar5;
    if (inv == 0) {
      uVar7 = uVar8;
    }
    pNVar1 = h->node + uVar7;
    pbVar2 = (byte *)((long)h->node + uVar7 * 0x18 + 8);
    bVar12 = pbVar2[1] & 0x40;
    if ((*pbVar2 & 0xf) == 0) {
      if (bVar12 != 0) {
        (pNVar1->u).key_tt = '\v';
      }
    }
    else {
      if (bVar12 == 0) {
        pGVar9 = (GCObject *)0x0;
      }
      else {
        pGVar9 = (pNVar1->u).key_val.gc;
      }
      iVar6 = iscleared(g,pGVar9);
      if (iVar6 == 0) {
        if ((((pNVar1->u).tt_ & 0x40) != 0) && (((*(GCObject **)pNVar1)->marked & 0x18) != 0)) {
          reallymarkobject(g,*(GCObject **)pNVar1);
          local_34 = 1;
        }
      }
      else if (((pNVar1->u).tt_ & 0x40) == 0) {
        bVar4 = true;
      }
      else {
        if ((((pNVar1->u).value_.gc)->marked & 0x18) != 0) {
          bVar3 = true;
        }
        bVar4 = true;
      }
    }
  }
  if (g->gcstate == '\0') {
    h->gclist = g->grayagain;
    g->grayagain = (GCObject *)h;
  }
  else if (bVar3) {
    h->gclist = g->ephemeron;
    g->ephemeron = (GCObject *)h;
  }
  else {
    if (!bVar4) {
      genlink(g,(GCObject *)h);
      return local_34;
    }
    h->gclist = g->allweak;
    g->allweak = (GCObject *)h;
  }
  h->marked = h->marked & 199;
  return local_34;
}

Assistant:

static int traverseephemeron (global_State *g, Table *h, int inv) {
  int marked = 0;  /* true if an object is marked in this traversal */
  int hasclears = 0;  /* true if table has white keys */
  int hasww = 0;  /* true if table has entry "white-key -> white-value" */
  unsigned int i;
  unsigned int asize = luaH_realasize(h);
  unsigned int nsize = sizenode(h);
  /* traverse array part */
  for (i = 0; i < asize; i++) {
    if (valiswhite(&h->array[i])) {
      marked = 1;
      reallymarkobject(g, gcvalue(&h->array[i]));
    }
  }
  /* traverse hash part; if 'inv', traverse descending
     (see 'convergeephemerons') */
  for (i = 0; i < nsize; i++) {
    Node *n = inv ? gnode(h, nsize - 1 - i) : gnode(h, i);
    if (isempty(gval(n)))  /* entry is empty? */
      clearkey(n);  /* clear its key */
    else if (iscleared(g, gckeyN(n))) {  /* key is not marked (yet)? */
      hasclears = 1;  /* table must be cleared */
      if (valiswhite(gval(n)))  /* value not marked yet? */
        hasww = 1;  /* white-white entry */
    }
    else if (valiswhite(gval(n))) {  /* value not marked yet? */
      marked = 1;
      reallymarkobject(g, gcvalue(gval(n)));  /* mark it now */
    }
  }
  /* link table into proper list */
  if (g->gcstate == GCSpropagate)
    linkgclist(h, g->grayagain);  /* must retraverse it in atomic phase */
  else if (hasww)  /* table has white->white entries? */
    linkgclist(h, g->ephemeron);  /* have to propagate again */
  else if (hasclears)  /* table has white keys? */
    linkgclist(h, g->allweak);  /* may have to clean white keys */
  else
    genlink(g, obj2gco(h));  /* check whether collector still needs to see it */
  return marked;
}